

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_599a8::IntrusiveListIteratorTest::
TestBackward<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
          (IntrusiveListIteratorTest *this,const_iterator first,const_iterator last,
          vector<int,_std::allocator<int>_> *expected)

{
  TestObject *pTVar1;
  bool bVar2;
  pointer pTVar3;
  int line;
  TestObject *pTVar4;
  TestObject *pTVar5;
  long lVar6;
  TestObject *pTVar7;
  char *message;
  unsigned_long uVar8;
  const_iterator rhs;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  AssertionResult gtest_ar;
  AssertHelper local_60;
  unsigned_long local_58;
  const_iterator local_50;
  const_iterator first_local;
  
  pTVar7 = last.node_;
  pTVar4 = (TestObject *)last.list_;
  pTVar5 = first.node_;
  first_local.node_ = (TestObject *)first.list_;
  lVar6 = 0;
  uVar8 = 0;
  local_50.list_ = (intrusive_list<(anonymous_namespace)::TestObject> *)pTVar5;
  first_local.list_ = (intrusive_list<(anonymous_namespace)::TestObject> *)this;
  do {
    rhs.node_ = pTVar4;
    rhs.list_ = (intrusive_list<(anonymous_namespace)::TestObject> *)pTVar5;
    local_58 = uVar8;
    bVar2 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator::operator!=
                      (&first_local,rhs);
    if (!bVar2) {
      local_78._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)(pTVar7->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ -
            (long)(pTVar7->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ >> 2)
      ;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar,"count","expected.size()",&local_58,
                 (unsigned_long *)&local_78);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_78);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          message = "";
        }
        else {
          message = *(char **)gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl;
        }
        line = 0xb0;
LAB_0013d27c:
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-intrusive-list.cc"
                   ,line,message);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (local_78._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_78._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      return;
    }
    if (pTVar4 == (TestObject *)0x0) {
      pTVar4 = pTVar5;
    }
    pTVar4 = (pTVar4->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_;
    pTVar1 = (pTVar7->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
    local_50.node_ = pTVar4;
    pTVar3 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator::operator->
                       (&local_50);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"expected[count]","last->data",
               (int *)((long)&(pTVar1->super_intrusive_list_base<(anonymous_namespace)::TestObject>)
                              .next_ + lVar6),&pTVar3->data);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_78);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        message = "";
      }
      else {
        message = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      line = 0xad;
      goto LAB_0013d27c;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    uVar8 = uVar8 + 1;
    lVar6 = lVar6 + 4;
  } while( true );
}

Assistant:

void TestBackward(Iter first, Iter last, const std::vector<int>& expected) {
    size_t count = 0;
    while (first != last) {
      --last;
      ASSERT_EQ(expected[count], last->data);
      ++count;
    }
    ASSERT_EQ(count, expected.size());
  }